

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,uint64_t ext_tag,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  ulong uVar2;
  pointer psVar3;
  size_t sVar4;
  iterator iVar5;
  pointer __dest;
  ulong uVar6;
  size_t __n;
  byte_string_type bs;
  pointer local_70;
  long local_68;
  long local_60;
  pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long> local_58;
  
  if ((this->options_).use_stringref_ == true) {
    uVar2 = this->next_stringref_;
    uVar6 = 3;
    if (((0x17 < uVar2) && (uVar6 = 4, 0xff < uVar2)) && (uVar6 = 5, 0xffff < uVar2)) {
      uVar6 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 7;
    }
    if (uVar6 <= b->size_) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,b->data_,
                 b->data_ + b->size_,(allocator_type *)&local_58);
      iVar5 = std::
              _Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
              ::find(&(this->bytestringref_map_)._M_t,(key_type *)&local_70);
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header) {
        sVar4 = this->next_stringref_;
        this->next_stringref_ = sVar4 + 1;
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar6 = local_68 - (long)local_70;
        if (uVar6 == 0) {
          __dest = (pointer)0x0;
        }
        else {
          if ((long)uVar6 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (pointer)operator_new(uVar6);
        }
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar6;
        __n = local_68 - (long)local_70;
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = __dest;
        if (__n != 0) {
          local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = __dest;
          memmove(__dest,local_70,__n);
        }
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
        local_58.second = sVar4;
        std::
        _Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>,std::_Select1st<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
        ::
        _M_emplace_unique<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long>>
                  ((_Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>,std::_Select1st<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
                    *)&this->bytestringref_map_,&local_58);
        if (local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.first.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.first.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.first.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        write_tag(this,ext_tag);
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = local_70;
        local_58.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_68 - (long)local_70);
        write_byte_string(this,(byte_string_view *)&local_58);
      }
      else {
        binary_stream_sink::push_back(&this->sink_,0xd8);
        binary_stream_sink::push_back(&this->sink_,'\x19');
        write_uint64_value(this,(uint64_t)iVar5._M_node[1]._M_right);
      }
      if (local_70 != (pointer)0x0) {
        operator_delete(local_70,local_60 - (long)local_70);
      }
      goto LAB_0029151b;
    }
  }
  write_tag(this,ext_tag);
  write_byte_string(this,b);
LAB_0029151b:
  psVar3 = (this->stack_).
           super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar3) {
    psVar1 = &psVar3[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           uint64_t ext_tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        if (options_.pack_strings() && b.size() >= jsoncons::cbor::detail::min_length_for_stringref(next_stringref_))
        {
            byte_string_type bs(b.data(), b.size(), alloc_);
            auto it = bytestringref_map_.find(bs);
            if (it == bytestringref_map_.end())
            {
                bytestringref_map_.emplace(std::make_pair(bs, next_stringref_++));
                write_tag(ext_tag);
                write_byte_string(bs);
            }
            else
            {
                write_tag(25);
                write_uint64_value((*it).second);
            }
        }
        else
        {
            write_tag(ext_tag);
            write_byte_string(b);
        }

        end_value();
        JSONCONS_VISITOR_RETURN;
    }